

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O3

uint32_t BrotliBuildHuffmanTable
                   (HuffmanCode *root_table,int root_bits,uint16_t *symbol_lists,uint16_t *count)

{
  long lVar1;
  byte *pbVar2;
  uint16_t *puVar3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint32_t uVar9;
  ulong uVar10;
  long lVar11;
  uint32_t uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  HuffmanCode *pHVar19;
  uint32_t uVar20;
  int iVar21;
  long lVar22;
  uint32_t local_70;
  uint local_6c;
  ulong local_68;
  
  lVar11 = -1;
  do {
    lVar22 = lVar11;
    lVar11 = lVar22 + -1;
  } while (symbol_lists[lVar22] == 0xffff);
  bVar6 = (byte)root_bits;
  uVar9 = 1 << (bVar6 & 0x1f);
  iVar13 = (int)(lVar22 + 0x10);
  uVar12 = 1 << ((byte)(lVar22 + 0x10) & 0x1f);
  iVar18 = iVar13;
  if (root_bits <= iVar13) {
    uVar12 = uVar9;
    iVar18 = root_bits;
  }
  iVar8 = 2;
  uVar10 = 0x80;
  lVar22 = 0;
  lVar11 = 1;
  do {
    uVar14 = (uint)count[lVar11];
    if (count[lVar11] != 0) {
      uVar17 = (uint)lVar11 - 0x10;
      do {
        uVar17 = (uint)symbol_lists[(int)uVar17];
        bVar4 = ""[lVar22];
        uVar20 = uVar12;
        do {
          iVar21 = uVar20 - iVar8;
          uVar20 = uVar20 - iVar8;
          root_table[(ulong)bVar4 + (long)iVar21] = (HuffmanCode)(uVar17 << 0x10 | (uint)lVar11);
        } while (0 < (int)uVar20);
        lVar22 = lVar22 + uVar10;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    iVar8 = iVar8 * 2;
    uVar10 = uVar10 >> 1;
    bVar5 = lVar11 < iVar18;
    lVar11 = lVar11 + 1;
  } while (bVar5);
  for (; uVar9 != uVar12; uVar12 = uVar12 * 2) {
    memcpy(root_table + (int)uVar12,root_table,(long)(int)uVar12 * 4);
  }
  local_68 = 0x80;
  local_70 = uVar9;
  if (root_bits < iVar13) {
    local_6c = root_bits + 1;
    lVar16 = 0x100;
    iVar18 = 2;
    lVar11 = (long)root_bits;
    pHVar19 = root_table;
    do {
      lVar1 = lVar11 + 1;
      if (count[lVar11 + 1] != 0) {
        uVar14 = (uint)lVar1 - root_bits;
        uVar17 = (int)lVar11 - 0xf;
        do {
          if (lVar16 == 0x100) {
            lVar16 = lVar11;
            iVar8 = 1 << ((byte)uVar14 & 0x1f);
            uVar7 = local_6c;
            uVar15 = (uint)lVar1;
            if (lVar11 < 0xe) {
              do {
                iVar21 = iVar8 - (uint)count[lVar16 + 1];
                uVar15 = uVar7;
                if (iVar21 == 0 || iVar8 < (int)(uint)count[lVar16 + 1]) goto LAB_00107214;
                lVar16 = lVar16 + 1;
                iVar8 = iVar21 * 2;
                uVar7 = uVar7 + 1;
              } while (lVar16 < 0xe);
              uVar15 = 0xf;
            }
LAB_00107214:
            pHVar19 = pHVar19 + (int)uVar9;
            uVar9 = 1 << ((char)uVar15 - bVar6 & 0x1f);
            local_70 = local_70 + uVar9;
            pbVar2 = "" + lVar22;
            lVar22 = lVar22 + (0x80UL >> (bVar6 - 1 & 0x3f));
            root_table[*pbVar2] =
                 (HuffmanCode)
                 (uVar15 & 0xff |
                 (((uint)((int)pHVar19 - (int)root_table) >> 2) - (uint)*pbVar2) * 0x10000);
            lVar16 = 0;
          }
          uVar17 = (uint)symbol_lists[(int)uVar17];
          bVar4 = ""[lVar16];
          uVar12 = uVar9;
          do {
            iVar8 = uVar12 - iVar18;
            uVar12 = uVar12 - iVar18;
            pHVar19[(ulong)bVar4 + (long)iVar8] = (HuffmanCode)(uVar17 * 0x10000 + (uVar14 & 0xff));
          } while (0 < (int)uVar12);
          lVar16 = lVar16 + local_68;
          puVar3 = count + lVar1;
          *puVar3 = *puVar3 - 1;
        } while (*puVar3 != 0);
      }
      iVar18 = iVar18 * 2;
      local_68 = local_68 >> 1;
      local_6c = local_6c + 1;
      lVar11 = lVar1;
    } while (lVar1 < iVar13);
  }
  return local_70;
}

Assistant:

uint32_t BrotliBuildHuffmanTable(HuffmanCode* root_table,
                                 int root_bits,
                                 const uint16_t* const symbol_lists,
                                 uint16_t* count) {
  HuffmanCode code;       /* current table entry */
  HuffmanCode* table;     /* next available space in table */
  int len;                /* current code length */
  int symbol;             /* symbol index in original or sorted table */
  brotli_reg_t key;       /* prefix code */
  brotli_reg_t key_step;  /* prefix code addend */
  brotli_reg_t sub_key;   /* 2nd level table prefix code */
  brotli_reg_t sub_key_step;  /* 2nd level table prefix code addend */
  int step;               /* step size to replicate values in current table */
  int table_bits;         /* key length of current table */
  int table_size;         /* size of current table */
  int total_size;         /* sum of root table size and 2nd level table sizes */
  int max_length = -1;
  int bits;
  int bits_count;

  BROTLI_DCHECK(root_bits <= BROTLI_REVERSE_BITS_MAX);
  BROTLI_DCHECK(BROTLI_HUFFMAN_MAX_CODE_LENGTH - root_bits <=
                BROTLI_REVERSE_BITS_MAX);

  while (symbol_lists[max_length] == 0xFFFF) max_length--;
  max_length += BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1;

  table = root_table;
  table_bits = root_bits;
  table_size = 1 << table_bits;
  total_size = table_size;

  /* Fill in the root table. Reduce the table size to if possible,
     and create the repetitions by memcpy. */
  if (table_bits > max_length) {
    table_bits = max_length;
    table_size = 1 << table_bits;
  }
  key = 0;
  key_step = BROTLI_REVERSE_BITS_LOWEST;
  bits = 1;
  step = 2;
  do {
    symbol = bits - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
    for (bits_count = count[bits]; bits_count != 0; --bits_count) {
      symbol = symbol_lists[symbol];
      code = ConstructHuffmanCode((uint8_t)bits, (uint16_t)symbol);
      ReplicateValue(&table[BrotliReverseBits(key)], step, table_size, code);
      key += key_step;
    }
    step <<= 1;
    key_step >>= 1;
  } while (++bits <= table_bits);

  /* If root_bits != table_bits then replicate to fill the remaining slots. */
  while (total_size != table_size) {
    memcpy(&table[table_size], &table[0],
           (size_t)table_size * sizeof(table[0]));
    table_size <<= 1;
  }

  /* Fill in 2nd level tables and add pointers to root table. */
  key_step = BROTLI_REVERSE_BITS_LOWEST >> (root_bits - 1);
  sub_key = (BROTLI_REVERSE_BITS_LOWEST << 1);
  sub_key_step = BROTLI_REVERSE_BITS_LOWEST;
  for (len = root_bits + 1, step = 2; len <= max_length; ++len) {
    symbol = len - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
    for (; count[len] != 0; --count[len]) {
      if (sub_key == (BROTLI_REVERSE_BITS_LOWEST << 1U)) {
        table += table_size;
        table_bits = NextTableBitSize(count, len, root_bits);
        table_size = 1 << table_bits;
        total_size += table_size;
        sub_key = BrotliReverseBits(key);
        key += key_step;
        root_table[sub_key] = ConstructHuffmanCode(
            (uint8_t)(table_bits + root_bits),
            (uint16_t)(((size_t)(table - root_table)) - sub_key));
        sub_key = 0;
      }
      symbol = symbol_lists[symbol];
      code = ConstructHuffmanCode((uint8_t)(len - root_bits), (uint16_t)symbol);
      ReplicateValue(
          &table[BrotliReverseBits(sub_key)], step, table_size, code);
      sub_key += sub_key_step;
    }
    step <<= 1;
    sub_key_step >>= 1;
  }
  return (uint32_t)total_size;
}